

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeNop(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  
  if (type.id == 0) {
    pEVar1 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x10,8);
    pEVar1->_id = NopId;
    (pEVar1->type).id = 0;
    return pEVar1;
  }
  __assert_fail("type == Type::none",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1116,"Expression *wasm::TranslateToFuzzReader::makeNop(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeNop(Type type) {
  assert(type == Type::none);
  return builder.makeNop();
}